

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::flattenUnknowns(SVInt *this)

{
  uint32_t uVar1;
  long *in_RDI;
  uint32_t i;
  uint32_t words;
  uint local_10;
  
  if ((*(byte *)((long)in_RDI + 0xd) & 1) != 0) {
    uVar1 = getNumWords(*(bitwidth_t *)(in_RDI + 1),false);
    for (local_10 = 0; local_10 < uVar1; local_10 = local_10 + 1) {
      *(ulong *)(*in_RDI + (ulong)local_10 * 8) =
           (*(ulong *)(*in_RDI + (ulong)(local_10 + uVar1) * 8) ^ 0xffffffffffffffff) &
           *(ulong *)(*in_RDI + (ulong)local_10 * 8);
      *(undefined8 *)(*in_RDI + (ulong)(local_10 + uVar1) * 8) = 0;
    }
    checkUnknown(this);
  }
  return;
}

Assistant:

void SVInt::flattenUnknowns() {
    if (!unknownFlag)
        return;

    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++) {
        pVal[i] &= ~pVal[i + words];
        pVal[i + words] = 0;
    }

    checkUnknown();
}